

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.c
# Opt level: O0

void progress_meter(connectdata *conn)

{
  Curl_easy *pCVar1;
  FILE *whereto;
  long lVar2;
  long lVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  long local_130;
  long local_120;
  curl_off_t local_118;
  long local_108;
  curl_off_t timespent;
  curl_off_t total_estimate;
  curl_off_t dlestimate;
  curl_off_t ulestimate;
  char time_spent [10];
  char time_total [10];
  char time_left [10];
  curl_off_t total_expected_transfer;
  curl_off_t total_transfer;
  curl_off_t total_percen;
  curl_off_t ulpercen;
  curl_off_t dlpercen;
  char max5 [6] [10];
  Curl_easy *data;
  connectdata *conn_local;
  
  pCVar1 = conn->data;
  ulpercen = 0;
  total_percen = 0;
  total_transfer = 0;
  dlestimate = 0;
  total_estimate = 0;
  lVar2 = (pCVar1->progress).timespent / 1000000;
  if (((pCVar1->progress).flags & 0x80U) == 0) {
    if ((pCVar1->state).resume_from != 0) {
      curl_mfprintf((pCVar1->set).err,"** Resuming transfer from byte position %ld\n",
                    (pCVar1->state).resume_from);
    }
    curl_mfprintf((pCVar1->set).err,
                  "  %% Total    %% Received %% Xferd  Average Speed   Time    Time     Time  Current\n                                 Dload  Upload   Total   Spent    Left  Speed\n"
                 );
    (pCVar1->progress).flags = (pCVar1->progress).flags | 0x80;
  }
  if ((((pCVar1->progress).flags & 0x20U) != 0) && (0 < (pCVar1->progress).ulspeed)) {
    dlestimate = (pCVar1->progress).size_ul / (pCVar1->progress).ulspeed;
    if ((pCVar1->progress).size_ul < 0x2711) {
      if (0 < (pCVar1->progress).size_ul) {
        total_percen = ((pCVar1->progress).uploaded * 100) / (pCVar1->progress).size_ul;
      }
    }
    else {
      total_percen = (pCVar1->progress).uploaded / ((pCVar1->progress).size_ul / 100);
    }
  }
  if ((((pCVar1->progress).flags & 0x40U) != 0) && (0 < (pCVar1->progress).dlspeed)) {
    total_estimate = (pCVar1->progress).size_dl / (pCVar1->progress).dlspeed;
    if ((pCVar1->progress).size_dl < 0x2711) {
      if (0 < (pCVar1->progress).size_dl) {
        ulpercen = ((pCVar1->progress).downloaded * 100) / (pCVar1->progress).size_dl;
      }
    }
    else {
      ulpercen = (pCVar1->progress).downloaded / ((pCVar1->progress).size_dl / 100);
    }
  }
  if (total_estimate < dlestimate) {
    local_108 = dlestimate;
  }
  else {
    local_108 = total_estimate;
  }
  if (local_108 < 1) {
    local_118 = 0;
  }
  else {
    local_118 = local_108 - lVar2;
  }
  time2str(time_total + 2,local_118);
  time2str(time_spent + 2,local_108);
  time2str((char *)((long)&ulestimate + 2),lVar2);
  if (((pCVar1->progress).flags & 0x20U) == 0) {
    local_120 = (pCVar1->progress).uploaded;
  }
  else {
    local_120 = (pCVar1->progress).size_ul;
  }
  if (((pCVar1->progress).flags & 0x40U) == 0) {
    local_130 = (pCVar1->progress).downloaded;
  }
  else {
    local_130 = (pCVar1->progress).size_dl;
  }
  lVar2 = local_120 + local_130;
  lVar3 = (pCVar1->progress).downloaded + (pCVar1->progress).uploaded;
  if (lVar2 < 0x2711) {
    if (0 < lVar2) {
      total_transfer = (lVar3 * 100) / lVar2;
    }
  }
  else {
    total_transfer = lVar3 / (lVar2 / 100);
  }
  whereto = (pCVar1->set).err;
  pcVar4 = max5data(lVar2,max5[1] + 2);
  pcVar5 = max5data((pCVar1->progress).downloaded,(char *)&dlpercen);
  pcVar6 = max5data((pCVar1->progress).uploaded,max5[0] + 2);
  pcVar7 = max5data((pCVar1->progress).dlspeed,max5[2] + 2);
  pcVar8 = max5data((pCVar1->progress).ulspeed,max5[3] + 2);
  pcVar9 = max5data((pCVar1->progress).current_speed,max5[4] + 2);
  curl_mfprintf(whereto,"\r%3ld %s  %3ld %s  %3ld %s  %s  %s %s %s %s %s",total_transfer,pcVar4,
                ulpercen,pcVar5,total_percen,pcVar6,pcVar7,pcVar8,time_spent + 2,
                (long)&ulestimate + 2,time_total + 2,pcVar9);
  fflush((FILE *)(pCVar1->set).err);
  return;
}

Assistant:

static void progress_meter(struct connectdata *conn)
{
  struct Curl_easy *data = conn->data;
  char max5[6][10];
  curl_off_t dlpercen = 0;
  curl_off_t ulpercen = 0;
  curl_off_t total_percen = 0;
  curl_off_t total_transfer;
  curl_off_t total_expected_transfer;
  char time_left[10];
  char time_total[10];
  char time_spent[10];
  curl_off_t ulestimate = 0;
  curl_off_t dlestimate = 0;
  curl_off_t total_estimate;
  curl_off_t timespent =
    (curl_off_t)data->progress.timespent/1000000; /* seconds */

  if(!(data->progress.flags & PGRS_HEADERS_OUT)) {
    if(data->state.resume_from) {
      fprintf(data->set.err,
              "** Resuming transfer from byte position %"
              CURL_FORMAT_CURL_OFF_T "\n", data->state.resume_from);
    }
    fprintf(data->set.err,
            "  %% Total    %% Received %% Xferd  Average Speed   "
            "Time    Time     Time  Current\n"
            "                                 Dload  Upload   "
            "Total   Spent    Left  Speed\n");
    data->progress.flags |= PGRS_HEADERS_OUT; /* headers are shown */
  }

  /* Figure out the estimated time of arrival for the upload */
  if((data->progress.flags & PGRS_UL_SIZE_KNOWN) &&
     (data->progress.ulspeed > CURL_OFF_T_C(0))) {
    ulestimate = data->progress.size_ul / data->progress.ulspeed;

    if(data->progress.size_ul > CURL_OFF_T_C(10000))
      ulpercen = data->progress.uploaded /
        (data->progress.size_ul/CURL_OFF_T_C(100));
    else if(data->progress.size_ul > CURL_OFF_T_C(0))
      ulpercen = (data->progress.uploaded*100) /
        data->progress.size_ul;
  }

  /* ... and the download */
  if((data->progress.flags & PGRS_DL_SIZE_KNOWN) &&
     (data->progress.dlspeed > CURL_OFF_T_C(0))) {
    dlestimate = data->progress.size_dl / data->progress.dlspeed;

    if(data->progress.size_dl > CURL_OFF_T_C(10000))
      dlpercen = data->progress.downloaded /
        (data->progress.size_dl/CURL_OFF_T_C(100));
    else if(data->progress.size_dl > CURL_OFF_T_C(0))
      dlpercen = (data->progress.downloaded*100) /
        data->progress.size_dl;
  }

  /* Now figure out which of them is slower and use that one for the
     total estimate! */
  total_estimate = ulestimate>dlestimate?ulestimate:dlestimate;

  /* create the three time strings */
  time2str(time_left, total_estimate > 0?(total_estimate - timespent):0);
  time2str(time_total, total_estimate);
  time2str(time_spent, timespent);

  /* Get the total amount of data expected to get transferred */
  total_expected_transfer =
    ((data->progress.flags & PGRS_UL_SIZE_KNOWN)?
     data->progress.size_ul:data->progress.uploaded)+
    ((data->progress.flags & PGRS_DL_SIZE_KNOWN)?
     data->progress.size_dl:data->progress.downloaded);

  /* We have transferred this much so far */
  total_transfer = data->progress.downloaded + data->progress.uploaded;

  /* Get the percentage of data transferred so far */
  if(total_expected_transfer > CURL_OFF_T_C(10000))
    total_percen = total_transfer /
      (total_expected_transfer/CURL_OFF_T_C(100));
  else if(total_expected_transfer > CURL_OFF_T_C(0))
    total_percen = (total_transfer*100) / total_expected_transfer;

  fprintf(data->set.err,
          "\r"
          "%3" CURL_FORMAT_CURL_OFF_T " %s  "
          "%3" CURL_FORMAT_CURL_OFF_T " %s  "
          "%3" CURL_FORMAT_CURL_OFF_T " %s  %s  %s %s %s %s %s",
          total_percen,  /* 3 letters */                /* total % */
          max5data(total_expected_transfer, max5[2]),   /* total size */
          dlpercen,      /* 3 letters */                /* rcvd % */
          max5data(data->progress.downloaded, max5[0]), /* rcvd size */
          ulpercen,      /* 3 letters */                /* xfer % */
          max5data(data->progress.uploaded, max5[1]),   /* xfer size */
          max5data(data->progress.dlspeed, max5[3]),    /* avrg dl speed */
          max5data(data->progress.ulspeed, max5[4]),    /* avrg ul speed */
          time_total,    /* 8 letters */                /* total time */
          time_spent,    /* 8 letters */                /* time spent */
          time_left,     /* 8 letters */                /* time left */
          max5data(data->progress.current_speed, max5[5])
    );

  /* we flush the output stream to make it appear as soon as possible */
  fflush(data->set.err);
}